

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  size_t pos;
  string *local_18;
  string *dependence_local;
  DependenceStruct *this_local;
  
  local_18 = dependence;
  dependence_local = &this->Name;
  std::__cxx11::string::string((string *)this);
  CompareStruct::CompareStruct(&this->Compare);
  local_30 = 0xffffffffffffffff;
  local_30 = std::__cxx11::string::find((char *)local_18,0x976f48);
  if (local_30 == -1) {
    local_30 = std::__cxx11::string::find((char *)local_18,0x976f4b);
    if (local_30 == -1) {
      local_30 = std::__cxx11::string::find((char *)local_18,0x99de4f);
      if (local_30 == -1) {
        local_30 = std::__cxx11::string::find((char *)local_18,0x9a4981);
        if (local_30 == -1) {
          local_30 = std::__cxx11::string::find((char *)local_18,0x983f05);
          if (local_30 != -1) {
            (this->Compare).Type = 4;
            std::__cxx11::string::substr((ulong)local_d0,(ulong)local_18);
            std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_d0);
            std::__cxx11::string::~string(local_d0);
          }
        }
        else {
          (this->Compare).Type = 1;
          std::__cxx11::string::substr((ulong)local_b0,(ulong)local_18);
          std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_b0);
          std::__cxx11::string::~string(local_b0);
        }
      }
      else {
        (this->Compare).Type = 2;
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_18);
        std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_90);
        std::__cxx11::string::~string(local_90);
      }
    }
    else {
      (this->Compare).Type = 5;
      std::__cxx11::string::substr((ulong)local_70,(ulong)local_18);
      std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  else {
    (this->Compare).Type = 3;
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_18);
    std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_50);
    std::__cxx11::string::~string(local_50);
  }
  if (local_30 == -1) {
    std::__cxx11::string::string(local_f0,(string *)local_18);
  }
  else {
    std::__cxx11::string::substr((ulong)local_f0,(ulong)local_18);
  }
  std::__cxx11::string::operator=((string *)this,local_f0);
  std::__cxx11::string::~string(local_f0);
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string &dependence)
{
  // Search compare section
  size_t pos = std::string::npos;
  if((pos = dependence.find("<=")) != std::string::npos)
    {
    Compare.Type = CompareLessOrEqual;
    Compare.Value = dependence.substr(pos + 2);
    }
  else if((pos = dependence.find(">=")) != std::string::npos)
    {
    Compare.Type = CompareGreaterOrEqual;
    Compare.Value = dependence.substr(pos + 2);
    }
  else if((pos = dependence.find("<")) != std::string::npos)
    {
    Compare.Type = CompareLess;
    Compare.Value = dependence.substr(pos + 1);
    }
  else if((pos = dependence.find("=")) != std::string::npos)
    {
    Compare.Type = CompareEqual;
    Compare.Value = dependence.substr(pos + 1);
    }
  else if((pos = dependence.find(">")) != std::string::npos)
    {
    Compare.Type = CompareGreater;
    Compare.Value = dependence.substr(pos + 1);
    }
  Name = pos == std::string::npos ? dependence : dependence.substr(0, pos);
}